

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

Value * __thiscall Json::Path::make(Path *this,Value *root)

{
  char *key;
  PathArgument *arg;
  pointer pPVar1;
  
  pPVar1 = (this->args_).super__Vector_base<Json::PathArgument,_std::allocator<Json::PathArgument>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pPVar1 != (this->args_).
                super__Vector_base<Json::PathArgument,_std::allocator<Json::PathArgument>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    do {
      if (pPVar1->kind_ == kindKey) {
        key = (pPVar1->key_)._M_dataplus._M_p;
        root = Value::resolveReference(root,key,key + (pPVar1->key_)._M_string_length);
      }
      else if (pPVar1->kind_ == kindIndex) {
        root = Value::operator[](root,pPVar1->index_);
      }
      pPVar1 = pPVar1 + 1;
    } while (pPVar1 != (this->args_).
                       super__Vector_base<Json::PathArgument,_std::allocator<Json::PathArgument>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  return root;
}

Assistant:

Value& Path::make(Value& root) const {
  Value* node = &root;
  for (Args::const_iterator it = args_.begin(); it != args_.end(); ++it) {
    const PathArgument& arg = *it;
    if (arg.kind_ == PathArgument::kindIndex) {
      if (!node->isArray()) {
        // Error: node is not an array at position ...
      }
      node = &((*node)[arg.index_]);
    } else if (arg.kind_ == PathArgument::kindKey) {
      if (!node->isObject()) {
        // Error: node is not an object at position...
      }
      node = &((*node)[arg.key_]);
    }
  }
  return *node;
}